

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

void __thiscall QMdiArea::~QMdiArea(QMdiArea *this)

{
  QMdiAreaPrivate *pQVar1;
  undefined8 *in_RDI;
  QMdiAreaPrivate *d;
  QAbstractScrollArea *this_00;
  
  *in_RDI = &PTR_metaObject_00d166a0;
  in_RDI[2] = &PTR__QMdiArea_00d16878;
  pQVar1 = d_func((QMdiArea *)0x612f0b);
  if (pQVar1->cascader != (Rearranger *)0x0) {
    (*pQVar1->cascader->_vptr_Rearranger[3])();
  }
  pQVar1->cascader = (Rearranger *)0x0;
  if (pQVar1->regularTiler != (Rearranger *)0x0) {
    (*pQVar1->regularTiler->_vptr_Rearranger[3])();
  }
  pQVar1->regularTiler = (Rearranger *)0x0;
  this_00 = (QAbstractScrollArea *)pQVar1->iconTiler;
  if (this_00 != (QAbstractScrollArea *)0x0) {
    (*(*(_func_int ***)&(this_00->super_QFrame).super_QWidget)[3])();
  }
  pQVar1->iconTiler = (Rearranger *)0x0;
  if (pQVar1->placer != (Placer *)0x0) {
    (*pQVar1->placer->_vptr_Placer[2])();
  }
  pQVar1->placer = (Placer *)0x0;
  QAbstractScrollArea::~QAbstractScrollArea(this_00);
  return;
}

Assistant:

QMdiArea::~QMdiArea()
{
    Q_D(QMdiArea);
    delete d->cascader;
    d->cascader = nullptr;

    delete d->regularTiler;
    d->regularTiler = nullptr;

    delete d->iconTiler;
    d->iconTiler = nullptr;

    delete d->placer;
    d->placer = nullptr;
}